

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O3

PropertyString * __thiscall
Js::LiteralStringWithPropertyStringPtr::GetOrAddPropertyString
          (LiteralStringWithPropertyStringPtr *this)

{
  PropertyString *pPVar1;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  
  pPVar1 = (this->propertyString).ptr;
  if (pPVar1 != (PropertyString *)0x0) {
    return pPVar1;
  }
  local_28 = (PropertyRecord *)0x0;
  GetPropertyRecordImpl(this,&local_28,false);
  pPVar1 = ScriptContext::GetPropertyString
                     ((((((this->super_LiteralString).super_JavascriptString.super_RecyclableObject.
                          type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                      scriptContext.ptr,local_28->pid);
  Memory::Recycler::WBSetBit((char *)&this->propertyString);
  (this->propertyString).ptr = pPVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->propertyString);
  return (this->propertyString).ptr;
}

Assistant:

PropertyString * LiteralStringWithPropertyStringPtr::GetOrAddPropertyString()
    {
        if (this->propertyString != nullptr)
        {
            return this->propertyString;
        }

        Js::PropertyRecord const * propertyRecord = nullptr;
        GetPropertyRecordImpl(&propertyRecord);

        this->propertyString = this->GetScriptContext()->GetPropertyString(propertyRecord->GetPropertyId());
        return this->propertyString;
    }